

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_2::ValidateInt32Operand
          (ValidationState_t *_,Instruction *inst,uint32_t operand_index,char *opcode_name,
          char *operand_name)

{
  uint32_t id;
  bool bVar1;
  uint id_00;
  uint32_t uVar2;
  Instruction *pIVar3;
  string sStack_228;
  DiagnosticStream local_208;
  
  id_00 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,(ulong)operand_index);
  pIVar3 = ValidationState_t::FindDef(_,id_00);
  id = (pIVar3->inst_).type_id;
  bVar1 = ValidationState_t::IsIntScalarType(_,id);
  if ((bVar1) && (uVar2 = ValidationState_t::GetBitWidth(_,id), uVar2 == 0x20)) {
    return SPV_SUCCESS;
  }
  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
  std::operator<<((ostream *)&local_208,opcode_name);
  std::operator<<((ostream *)&local_208," ");
  std::operator<<((ostream *)&local_208,operand_name);
  std::operator<<((ostream *)&local_208," type <id> ");
  ValidationState_t::getIdName_abi_cxx11_(&sStack_228,_,id);
  std::operator<<((ostream *)&local_208,(string *)&sStack_228);
  std::operator<<((ostream *)&local_208," is not a 32 bit integer.");
  std::__cxx11::string::_M_dispose();
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t ValidateInt32Operand(ValidationState_t& _, const Instruction* inst,
                                  uint32_t operand_index,
                                  const char* opcode_name,
                                  const char* operand_name) {
  const auto type_id =
      _.FindDef(inst->GetOperandAs<uint32_t>(operand_index))->type_id();
  if (!_.IsIntScalarType(type_id) || _.GetBitWidth(type_id) != 32) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << opcode_name << " " << operand_name << " type <id> "
           << _.getIdName(type_id) << " is not a 32 bit integer.";
  }
  return SPV_SUCCESS;
}